

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_color_stats_add(LodePNGColorStats *stats,uint r,uint g,uint b,uint a)

{
  uint uVar1;
  uchar image [8];
  LodePNGColorMode mode;
  uchar local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined2 local_42;
  LodePNGColorMode local_40;
  
  local_40.key_defined = 0;
  local_40.key_r = 0;
  local_40.key_g = 0;
  local_40.key_b = 0;
  local_40.colortype = LCT_RGBA;
  local_40.bitdepth = 0x10;
  local_40.palette = (uchar *)0x0;
  local_40.palettesize = 0;
  local_48 = (uchar)(r >> 8);
  local_47 = (undefined1)r;
  local_46 = (undefined1)(g >> 8);
  local_45 = (undefined1)g;
  local_44 = (undefined1)(b >> 8);
  local_43 = (undefined1)b;
  local_42 = 0xffff;
  uVar1 = lodepng_compute_color_stats(stats,&local_48,1,1,&local_40);
  if (local_40.palette != (uchar *)0x0) {
    free(local_40.palette);
  }
  return uVar1;
}

Assistant:

static unsigned lodepng_color_stats_add(LodePNGColorStats* stats,
                                        unsigned r, unsigned g, unsigned b, unsigned a) {
  unsigned error = 0;
  unsigned char image[8];
  LodePNGColorMode mode;
  lodepng_color_mode_init(&mode);
  image[0] = r >> 8; image[1] = r; image[2] = g >> 8; image[3] = g;
  image[4] = b >> 8; image[5] = b; image[6] = a >> 8; image[7] = a;
  mode.bitdepth = 16;
  mode.colortype = LCT_RGBA;
  error = lodepng_compute_color_stats(stats, image, 1, 1, &mode);
  lodepng_color_mode_cleanup(&mode);
  return error;
}